

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# response.c
# Opt level: O1

char * INT_create_bridge_action_spec(int stone_id,char *contact)

{
  size_t sVar1;
  char *__s;
  
  sVar1 = strlen(contact);
  __s = (char *)INT_CMmalloc((long)((int)sVar1 + 0x21));
  sprintf(__s,"Bridge Action %d %s",stone_id,contact);
  return __s;
}

Assistant:

char *
INT_create_bridge_action_spec(int stone_id, char *contact)
{
    int size = (int) strlen(contact);
    char *output;
    size += (int) strlen("Bridge Action") + 20;
    output = malloc(size);
    sprintf(output, "Bridge Action %d %s", stone_id, contact);
    return output;
}